

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O3

bool __thiscall
Assimp::LWOImporter::HandleTextures
          (LWOImporter *this,aiMaterial *pcMat,TextureList *in,aiTextureType type)

{
  int iVar1;
  pointer pCVar2;
  ulong __n;
  byte bVar3;
  byte bVar4;
  aiMaterial *paVar5;
  size_type sVar6;
  size_type sVar7;
  bool bVar8;
  Logger *pLVar10;
  pointer pCVar11;
  pointer pCVar12;
  _Alloc_hider _Var13;
  _List_node_base *p_Var14;
  uint index;
  uint temp;
  int mapping_;
  aiString s;
  uint local_488;
  undefined4 local_484;
  aiMaterial *local_480;
  _List_node_base *local_478;
  aiTextureType local_46c;
  LWOImporter *local_468;
  string local_460;
  undefined4 local_440;
  undefined8 local_43c;
  aiString local_434;
  bool bVar9;
  
  local_480 = pcMat;
  if (pcMat == (aiMaterial *)0x0) {
    __assert_fail("__null != pcMat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOMaterial.cpp"
                  ,0x59,
                  "bool Assimp::LWOImporter::HandleTextures(aiMaterial *, const TextureList &, aiTextureType)"
                 );
  }
  index = 0;
  local_488 = 0;
  local_434.length = 0;
  local_434.data._0_8_ = local_434.data._0_8_ & 0xffffffffffffff00;
  memset(local_434.data + 1,0x1b,0x3ff);
  p_Var14 = (in->super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  bVar9 = false;
  bVar8 = false;
  local_478 = (_List_node_base *)in;
  local_46c = type;
  local_468 = this;
  if (p_Var14 != (_List_node_base *)in) {
    do {
      bVar8 = bVar9;
      if ((*(char *)((long)&p_Var14[6]._M_next + 4) == '\x01') &&
         (*(undefined1 *)((long)&p_Var14[6]._M_prev + 4) == '\x01')) {
        switch(*(undefined4 *)&p_Var14[7]._M_next) {
        case 0:
          local_484 = 4;
          break;
        case 1:
          local_484 = 2;
          bVar4 = 1;
          goto LAB_0041f6ed;
        case 2:
          local_484 = 1;
          bVar3 = 1;
          bVar4 = 0;
          goto LAB_0041f6ef;
        case 3:
          local_484 = 3;
          break;
        case 4:
          pLVar10 = DefaultLogger::get();
          Logger::error(pLVar10,"LWO2: Unsupported texture mapping: FrontProjection");
          local_484 = 5;
          break;
        case 5:
          if (*(uint *)&p_Var14[6]._M_next != 0xffffffff) {
            local_488 = *(uint *)&p_Var14[6]._M_next;
            aiMaterial::AddBinaryProperty
                      (local_480,&local_488,4,"$tex.uvwsrc",type,index,aiPTI_Integer);
            local_484 = 0;
            goto LAB_0041f7c2;
          }
          goto LAB_0041fbb3;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOMaterial.cpp"
                        ,0x8a,
                        "bool Assimp::LWOImporter::HandleTextures(aiMaterial *, const TextureList &, aiTextureType)"
                       );
        }
        bVar4 = 0;
LAB_0041f6ed:
        bVar3 = 0;
LAB_0041f6ef:
        iVar1 = *(int *)((long)&p_Var14[7]._M_next + 4);
        if (iVar1 == 1) {
          local_440 = 0;
          local_43c = 0x3f800000;
        }
        else if (iVar1 == 0) {
          local_440 = 0x3f800000;
          local_43c = 0;
        }
        else {
          local_440 = 0;
          local_43c = 0x3f80000000000000;
        }
        aiMaterial::AddBinaryProperty
                  (local_480,&local_440,0xc,"$tex.mapaxis",type,index,aiPTI_Float);
        if ((bool)(bVar4 | bVar3)) {
          local_460._M_dataplus._M_p = (pointer)0x0;
          local_460.field_2._M_allocated_capacity._0_4_ = 0;
          local_460._M_string_length =
               CONCAT44((int)p_Var14[7]._M_prev,(int)((ulong)p_Var14[7]._M_prev >> 0x20));
          aiMaterial::AddBinaryProperty
                    (local_480,&local_460,0x14,"$tex.uvtrafo",type,index,aiPTI_Float);
        }
        pLVar10 = DefaultLogger::get();
        Logger::debug(pLVar10,"LWO2: Setting up non-UV mapping");
        in = (TextureList *)local_478;
LAB_0041f7c2:
        if (local_468->mIsLWO2 == true) {
          pCVar2 = (local_468->mClips).
                   super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          local_488 = *(uint *)&p_Var14[3]._M_next;
          pCVar11 = (local_468->mClips).
                    super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pCVar12 = pCVar2;
          if (pCVar11 != pCVar2) {
            do {
              if (pCVar11->idx == local_488) {
                pCVar12 = pCVar11;
              }
              pCVar11 = pCVar11 + 1;
            } while (pCVar11 != pCVar2);
            if (pCVar12 != pCVar2) {
              if (pCVar12->type != UNSUPPORTED) {
                AdjustTexturePath(local_468,&pCVar12->path);
                __n = (pCVar12->path)._M_string_length;
                if (__n < 0x400) {
                  local_434.length = (ai_uint32)__n;
                  memcpy(local_434.data,(pCVar12->path)._M_dataplus._M_p,__n);
                  local_434.data[__n] = '\0';
                }
                type = local_46c;
                local_460._M_dataplus._M_p._0_4_ = (uint)pCVar12->negate;
                aiMaterial::AddBinaryProperty
                          (local_480,&local_460,4,"$tex.flags",local_46c,index,aiPTI_Integer);
                goto LAB_0041f9d6;
              }
              pLVar10 = DefaultLogger::get();
              Logger::error(pLVar10,"LWO2: Clip type is not supported");
              goto LAB_0041fbb3;
            }
          }
          pLVar10 = DefaultLogger::get();
          Logger::error(pLVar10,"LWO2: Clip index is out of bounds");
          local_488 = 0;
          local_434.length = 0xc;
          builtin_strncpy(local_434.data,"$texture.png",0xd);
LAB_0041f9d6:
          paVar5 = local_480;
          aiMaterial::AddProperty(local_480,&local_434,"$tex.file",type,index);
          aiMaterial::AddBinaryProperty
                    (paVar5,(_List_node_base **)((long)&p_Var14[3]._M_next + 4),4,"$tex.blend",type,
                     index,aiPTI_Float);
          switch(*(undefined4 *)&p_Var14[6]._M_prev) {
          case 0:
          case 3:
            local_488 = 0;
            break;
          case 1:
          case 2:
            local_488 = 2;
            break;
          case 4:
            local_488 = 3;
            break;
          default:
            local_488 = 0;
            pLVar10 = DefaultLogger::get();
            Logger::warn(pLVar10,"LWO2: Unsupported texture blend mode: alpha or displacement");
            break;
          case 7:
            local_488 = 1;
          }
          paVar5 = local_480;
          aiMaterial::AddBinaryProperty(local_480,&local_488,4,"$tex.op",type,index,aiPTI_Integer);
          local_460._M_dataplus._M_p._0_4_ = local_484;
          aiMaterial::AddBinaryProperty(paVar5,&local_460,4,"$tex.mapping",type,index,aiPTI_Integer)
          ;
          iVar1 = *(int *)&p_Var14[8]._M_next;
          if (iVar1 == 0) {
            pLVar10 = DefaultLogger::get();
            Logger::warn(pLVar10,"LWO2: Unsupported texture map mode: RESET");
LAB_0041fb11:
            local_488 = 1;
          }
          else {
            if (iVar1 == 3) goto LAB_0041fb11;
            local_488 = 0;
            if (iVar1 == 2) {
              local_488 = 2;
            }
          }
          in = (TextureList *)local_478;
          aiMaterial::AddBinaryProperty
                    (local_480,&local_488,4,"$tex.mapmodeu",type,index,aiPTI_Integer);
          iVar1 = *(int *)((long)&p_Var14[8]._M_next + 4);
          if (iVar1 == 0) {
            pLVar10 = DefaultLogger::get();
            Logger::warn(pLVar10,"LWO2: Unsupported texture map mode: RESET");
LAB_0041fb7f:
            local_488 = 1;
          }
          else {
            if (iVar1 == 3) goto LAB_0041fb7f;
            local_488 = 0;
            if (iVar1 == 2) {
              local_488 = 2;
            }
          }
          aiMaterial::AddBinaryProperty
                    (local_480,&local_488,4,"$tex.mapmodev",type,index,aiPTI_Integer);
          index = index + 1;
        }
        else {
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_460,p_Var14[1]._M_next,
                     (long)&(p_Var14[1]._M_prev)->_M_next + (long)p_Var14[1]._M_next);
          sVar6 = local_460._M_string_length;
          if (local_460._M_string_length == 0) {
            pLVar10 = DefaultLogger::get();
            Logger::warn(pLVar10,"LWOB: Empty file name");
            _Var13._M_p = local_460._M_dataplus._M_p;
          }
          else {
            AdjustTexturePath(local_468,&local_460);
            sVar7 = local_460._M_string_length;
            _Var13._M_p = local_460._M_dataplus._M_p;
            in = (TextureList *)local_478;
            if (local_460._M_string_length < 0x400) {
              local_434.length = (ai_uint32)local_460._M_string_length;
              memcpy(local_434.data,local_460._M_dataplus._M_p,local_460._M_string_length);
              local_434.data[sVar7] = '\0';
              in = (TextureList *)local_478;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p != &local_460.field_2) {
            operator_delete(_Var13._M_p);
          }
          type = local_46c;
          if (sVar6 != 0) goto LAB_0041f9d6;
        }
LAB_0041fbb3:
        bVar8 = true;
      }
      p_Var14 = (((_List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)
                 &p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      bVar9 = bVar8;
    } while (p_Var14 != (_List_node_base *)in);
  }
  return bVar8;
}

Assistant:

bool LWOImporter::HandleTextures(aiMaterial* pcMat, const TextureList& in, aiTextureType type)
{
    ai_assert(NULL != pcMat);

    unsigned int cur = 0, temp = 0;
    aiString s;
    bool ret = false;

    for (const auto &texture : in)    {
        if (!texture.enabled || !texture.bCanUse)
            continue;
        ret = true;

        // Convert lightwave's mapping modes to ours. We let them
        // as they are, the GenUVcoords step will compute UV
        // channels if they're not there.

        aiTextureMapping mapping;
        switch (texture.mapMode)
        {
            case LWO::Texture::Planar:
                mapping = aiTextureMapping_PLANE;
                break;
            case LWO::Texture::Cylindrical:
                mapping = aiTextureMapping_CYLINDER;
                break;
            case LWO::Texture::Spherical:
                mapping = aiTextureMapping_SPHERE;
                break;
            case LWO::Texture::Cubic:
                mapping = aiTextureMapping_BOX;
                break;
            case LWO::Texture::FrontProjection:
                ASSIMP_LOG_ERROR("LWO2: Unsupported texture mapping: FrontProjection");
                mapping = aiTextureMapping_OTHER;
                break;
            case LWO::Texture::UV:
                {
                    if( UINT_MAX == texture.mRealUVIndex ) {
                        // We have no UV index for this texture, so we can't display it
                        continue;
                    }

                    // add the UV source index
                    temp = texture.mRealUVIndex;
                    pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_UVWSRC(type,cur));

                    mapping = aiTextureMapping_UV;
                }
                break;
            default:
                ai_assert(false);
        };

        if (mapping != aiTextureMapping_UV) {
            // Setup the main axis
            aiVector3D v;
            switch (texture.majorAxis) {
                case Texture::AXIS_X:
                    v = aiVector3D(1.0,0.0,0.0);
                    break;
                case Texture::AXIS_Y:
                    v = aiVector3D(0.0,1.0,0.0);
                    break;
                default: // case Texture::AXIS_Z:
                    v = aiVector3D(0.0,0.0,1.0);
                    break;
            }

            pcMat->AddProperty(&v,1,AI_MATKEY_TEXMAP_AXIS(type,cur));

            // Setup UV scalings for cylindric and spherical projections
            if (mapping == aiTextureMapping_CYLINDER || mapping == aiTextureMapping_SPHERE) {
                aiUVTransform trafo;
                trafo.mScaling.x = texture.wrapAmountW;
                trafo.mScaling.y = texture.wrapAmountH;

                static_assert(sizeof(aiUVTransform)/sizeof(ai_real) == 5, "sizeof(aiUVTransform)/sizeof(ai_real) == 5");
                pcMat->AddProperty(&trafo,1,AI_MATKEY_UVTRANSFORM(type,cur));
            }
            ASSIMP_LOG_DEBUG("LWO2: Setting up non-UV mapping");
        }

        // The older LWOB format does not use indirect references to clips.
        // The file name of a texture is directly specified in the tex chunk.
        if (mIsLWO2)    {
            // find the corresponding clip (take the last one if multiple
            // share the same index)
            ClipList::iterator end = mClips.end(), candidate = end;
            temp = texture.mClipIdx;
            for (ClipList::iterator clip = mClips.begin(); clip != end; ++clip) {
                if ((*clip).idx == temp) {
                    candidate = clip;
                }

            }
            if (candidate == end)   {
                ASSIMP_LOG_ERROR("LWO2: Clip index is out of bounds");
                temp = 0;

                // fixme: apparently some LWO files shipping with Doom3 don't
                // have clips at all ... check whether that's true or whether
                // it's a bug in the loader.

                s.Set("$texture.png");

                //continue;
            }
            else {
                if (Clip::UNSUPPORTED == (*candidate).type) {
                    ASSIMP_LOG_ERROR("LWO2: Clip type is not supported");
                    continue;
                }
                AdjustTexturePath((*candidate).path);
                s.Set((*candidate).path);

                // Additional image settings
                int flags = 0;
                if ((*candidate).negate) {
                    flags |= aiTextureFlags_Invert;
                }
                pcMat->AddProperty(&flags,1,AI_MATKEY_TEXFLAGS(type,cur));
            }
        }
        else
        {
            std::string ss = texture.mFileName;
            if (!ss.length()) {
                ASSIMP_LOG_WARN("LWOB: Empty file name");
                continue;
            }
            AdjustTexturePath(ss);
            s.Set(ss);
        }
        pcMat->AddProperty(&s,AI_MATKEY_TEXTURE(type,cur));

        // add the blend factor
        pcMat->AddProperty<float>(&texture.mStrength,1,AI_MATKEY_TEXBLEND(type,cur));

        // add the blend operation
        switch (texture.blendType)
        {
            case LWO::Texture::Normal:
            case LWO::Texture::Multiply:
                temp = (unsigned int)aiTextureOp_Multiply;
                break;

            case LWO::Texture::Subtractive:
            case LWO::Texture::Difference:
                temp = (unsigned int)aiTextureOp_Subtract;
                break;

            case LWO::Texture::Divide:
                temp = (unsigned int)aiTextureOp_Divide;
                break;

            case LWO::Texture::Additive:
                temp = (unsigned int)aiTextureOp_Add;
                break;

            default:
                temp = (unsigned int)aiTextureOp_Multiply;
                ASSIMP_LOG_WARN("LWO2: Unsupported texture blend mode: alpha or displacement");

        }
        // Setup texture operation
        pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_TEXOP(type,cur));

        // setup the mapping mode
        int mapping_ = static_cast<int>(mapping);
        pcMat->AddProperty<int>(&mapping_, 1, AI_MATKEY_MAPPING(type, cur));

        // add the u-wrapping
        temp = (unsigned int)GetMapMode(texture.wrapModeWidth);
        pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_MAPPINGMODE_U(type,cur));

        // add the v-wrapping
        temp = (unsigned int)GetMapMode(texture.wrapModeHeight);
        pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_MAPPINGMODE_V(type,cur));

        ++cur;
    }
    return ret;
}